

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int luaopen_string(lua_State *L)

{
  GCtab *t;
  ulong uVar1;
  TValue *pTVar2;
  
  lj_lib_register(L,"string",lj_lib_init_string,lj_lib_cf_string);
  t = lj_tab_new(L,0,1);
  uVar1 = (ulong)(L->glref).ptr32;
  *(int *)(uVar1 + 0x200) = (int)t;
  pTVar2 = lj_tab_setstr(L,t,(GCstr *)(ulong)*(uint *)(uVar1 + 0x198));
  (pTVar2->field_2).field_0 = L->top[-1].field_2.field_0;
  (pTVar2->field_2).it = 0xfffffff4;
  t->nomm = 0xfe;
  return 1;
}

Assistant:

LUALIB_API int luaopen_string(lua_State *L)
{
  GCtab *mt;
  global_State *g;
  LJ_LIB_REG(L, LUA_STRLIBNAME, string);
  mt = lj_tab_new(L, 0, 1);
  /* NOBARRIER: basemt is a GC root. */
  g = G(L);
  setgcref(basemt_it(g, LJ_TSTR), obj2gco(mt));
  settabV(L, lj_tab_setstr(L, mt, mmname_str(g, MM_index)), tabV(L->top-1));
  mt->nomm = (uint8_t)(~(1u<<MM_index));
  return 1;
}